

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.hh
# Opt level: O1

int4 __thiscall Varnode::termOrder(Varnode *this,Varnode *op)

{
  uint uVar1;
  pointer ppVVar2;
  AddrSpace *pAVar3;
  AddrSpace *pAVar4;
  int4 iVar5;
  bool bVar6;
  
  uVar1 = op->flags;
  if ((this->flags & 2) != 0) {
    if ((uVar1 & 2) != 0) {
      return 0;
    }
    return 1;
  }
  if ((uVar1 & 2) != 0) {
    return -1;
  }
  if ((((this->flags & 0x10) != 0) && (this->def->opcode->opcode == CPUI_INT_MULT)) &&
     (ppVVar2 = (this->def->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                _M_impl.super__Vector_impl_data._M_start, (ppVVar2[1]->flags & 2) != 0)) {
    this = *ppVVar2;
  }
  if ((((uVar1 & 0x10) != 0) && (op->def->opcode->opcode == CPUI_INT_MULT)) &&
     (ppVVar2 = (op->def->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start, (ppVVar2[1]->flags & 2) != 0)) {
    op = *ppVVar2;
  }
  pAVar3 = (this->loc).base;
  pAVar4 = (op->loc).base;
  if (pAVar3 == pAVar4) {
    bVar6 = (this->loc).offset < (op->loc).offset;
LAB_0026c947:
    if (bVar6) {
      bVar6 = true;
      iVar5 = -1;
      goto LAB_0026c996;
    }
  }
  else if (pAVar3 != (AddrSpace *)0xffffffffffffffff) {
    bVar6 = true;
    iVar5 = -1;
    if ((pAVar3 == (AddrSpace *)0x0) || (pAVar4 == (AddrSpace *)0xffffffffffffffff))
    goto LAB_0026c996;
    if (pAVar4 != (AddrSpace *)0x0) {
      bVar6 = pAVar3->index < pAVar4->index;
      goto LAB_0026c947;
    }
  }
  if (pAVar3 == pAVar4) {
    bVar6 = (op->loc).offset < (this->loc).offset;
    iVar5 = 1;
  }
  else {
    bVar6 = true;
    iVar5 = 1;
    if (pAVar4 != (AddrSpace *)0x0) {
      if ((pAVar4 == (AddrSpace *)0xffffffffffffffff) || (pAVar3 == (AddrSpace *)0x0)) {
        bVar6 = false;
      }
      else if (pAVar3 != (AddrSpace *)0xffffffffffffffff) {
        bVar6 = pAVar4->index < pAVar3->index;
      }
    }
  }
LAB_0026c996:
  if (!bVar6) {
    return 0;
  }
  return iVar5;
}

Assistant:

bool isConstant(void) const { return ((flags&Varnode::constant)!=0); }